

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O1

void pack_dict(lua_State *L,bson *b,_Bool isarray)

{
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  lua_Integer lVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  size_t sz;
  char numberkey [32];
  size_t local_68;
  size_t local_60;
  char local_58 [10] [4];
  
  local_60 = (size_t)b->size;
  iVar6 = b->size + 4;
  iVar1 = b->cap;
  if (iVar1 < iVar6) {
    do {
      iVar1 = iVar1 * 2;
    } while (iVar1 <= iVar6);
    b->cap = iVar1;
    if (b->ptr == b->buffer) {
      puVar3 = (uint8_t *)malloc((long)iVar1);
      b->ptr = puVar3;
      memcpy(puVar3,b->buffer,local_60);
    }
    else {
      puVar3 = (uint8_t *)realloc(b->ptr,(long)iVar1);
      b->ptr = puVar3;
    }
  }
  b->size = b->size + 4;
  lua_pushnil(L);
  iVar1 = lua_next(L,-2);
  if (iVar1 != 0) {
    do {
      iVar1 = lua_type(L,-2);
      if (isarray) {
        if (iVar1 != 3) {
          pcVar7 = "Invalid array key type : %s";
LAB_0011a8bb:
          pcVar5 = lua_typename(L,iVar1);
          luaL_error(L,pcVar7,pcVar5);
          return;
        }
        lVar4 = lua_tointegerx(L,-2,(int *)0x0);
        uVar2 = (int)lVar4 - 1;
        if (uVar2 < 0x400) {
          local_58[0] = bson_numstrs[uVar2];
          iVar1 = bson_numstr_len[uVar2];
        }
        else {
          iVar1 = sprintf(local_58[0],"%u",(ulong)uVar2);
        }
        local_68 = (size_t)iVar1;
        append_one(b,L,local_58[0],local_68);
        iVar1 = -2;
      }
      else if (iVar1 == 4) {
        iVar1 = -2;
        pcVar7 = lua_tolstring(L,-2,&local_68);
        append_one(b,L,pcVar7,local_68);
      }
      else {
        if (iVar1 != 3) {
          pcVar7 = "Invalid key type : %s";
          goto LAB_0011a8bb;
        }
        lua_pushvalue(L,-2);
        lua_rotate(L,-2,1);
        pcVar7 = lua_tolstring(L,-2,&local_68);
        append_one(b,L,pcVar7,local_68);
        iVar1 = -3;
      }
      lua_settop(L,iVar1);
      iVar1 = lua_next(L,-2);
    } while (iVar1 != 0);
  }
  iVar1 = b->size;
  iVar6 = b->cap;
  if (iVar6 <= iVar1) {
    do {
      iVar6 = iVar6 * 2;
    } while (iVar6 <= iVar1 + 1);
    b->cap = iVar6;
    if (b->ptr == b->buffer) {
      puVar3 = (uint8_t *)malloc((long)iVar6);
      b->ptr = puVar3;
      memcpy(puVar3,b->buffer,(long)iVar1);
    }
    else {
      puVar3 = (uint8_t *)realloc(b->ptr,(long)iVar6);
      b->ptr = puVar3;
    }
  }
  iVar1 = b->size;
  b->size = iVar1 + 1;
  b->ptr[iVar1] = '\0';
  iVar1 = b->size - (int)local_60;
  b->ptr[local_60] = (uint8_t)iVar1;
  b->ptr[local_60 + 1] = (uint8_t)((uint)iVar1 >> 8);
  b->ptr[local_60 + 2] = (uint8_t)((uint)iVar1 >> 0x10);
  b->ptr[local_60 + 3] = (uint8_t)((uint)iVar1 >> 0x18);
  return;
}

Assistant:

static void
pack_dict(lua_State *L, struct bson *b, bool isarray) {
	int length = reserve_length(b);
	lua_pushnil(L);
	while(lua_next(L,-2) != 0) {
		int kt = lua_type(L, -2);
		char numberkey[32];
		const char * key = NULL;
		size_t sz;
		if (isarray) {
			if (kt != LUA_TNUMBER) {
				luaL_error(L, "Invalid array key type : %s", lua_typename(L, kt));
				return;
			}
			sz = bson_numstr(numberkey, (unsigned int)lua_tointeger(L,-2)-1);
			key = numberkey;

			append_one(b, L, key, sz);
			lua_pop(L,1);
		} else {
			switch(kt) {
			case LUA_TNUMBER:
				// copy key, don't change key type
				lua_pushvalue(L,-2);
				lua_insert(L,-2);
				key = lua_tolstring(L,-2,&sz);
				append_one(b, L, key, sz);
				lua_pop(L,2);
				break;
			case LUA_TSTRING:
				key = lua_tolstring(L,-2,&sz);
				append_one(b, L, key, sz);
				lua_pop(L,1);
				break;
			default:
				luaL_error(L, "Invalid key type : %s", lua_typename(L, kt));
				return;
			}
		}
	}
	write_byte(b,0);
	write_length(b, b->size - length, length);
}